

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_mipsdsp_arith(DisasContext_conflict6 *ctx,uint32_t op1,uint32_t op2,int ret,int v1,int v2)

{
  TCGContext_conflict6 *s;
  uintptr_t o_62;
  TCGTemp *pTVar1;
  TCGTemp *pTVar2;
  TCGv_i32 pTVar3;
  undefined4 in_register_00000014;
  code *pcVar4;
  uintptr_t o_3;
  TCGv_i64 pTVar5;
  TCGv_i64 arg1;
  int iVar6;
  uintptr_t o_2;
  uintptr_t o_75;
  TCGTemp *local_58;
  TCGTemp *local_50;
  TCGTemp *local_48;
  int local_3c;
  undefined8 local_38;
  
  local_38 = CONCAT44(in_register_00000014,op2);
  if (ret == 0) {
    return;
  }
  s = ctx->uc->tcg_ctx;
  local_3c = v2;
  pTVar1 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
  pTVar5 = (TCGv_i64)((long)pTVar1 - (long)s);
  pTVar2 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
  if (v1 == 0) {
    tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)pTVar1,0);
  }
  else if (s->cpu_gpr[v1] != pTVar5) {
    tcg_gen_op2_mips64el
              (s,INDEX_op_mov_i64,(TCGArg)pTVar1,(TCGArg)((long)&s->pool_cur + (long)s->cpu_gpr[v1])
              );
  }
  arg1 = (TCGv_i64)((long)pTVar2 - (long)s);
  if (local_3c == 0) {
    tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)pTVar2,0);
    iVar6 = (int)local_38;
  }
  else {
    iVar6 = (int)local_38;
    if (s->cpu_gpr[local_3c] != arg1) {
      tcg_gen_op2_mips64el
                (s,INDEX_op_mov_i64,(TCGArg)pTVar2,(TCGArg)(s->cpu_gpr[local_3c] + (long)s));
    }
  }
  switch(op1) {
  case 0x7c000010:
    switch((iVar6 + 0x83fffff0U) * 0x4000000 | iVar6 + 0x83fffff0U >> 6) {
    case 0:
      check_dsp(ctx);
      local_48 = (TCGTemp *)(s->cpu_env + (long)s);
      pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
      pcVar4 = helper_addu_qb_mips64el;
      break;
    case 1:
      check_dsp(ctx);
      local_48 = (TCGTemp *)(s->cpu_env + (long)s);
      pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
      pcVar4 = helper_subu_qb_mips64el;
      break;
    default:
      goto switchD_009b9d17_caseD_7c000013;
    case 4:
      check_dsp(ctx);
      local_48 = (TCGTemp *)(s->cpu_env + (long)s);
      pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
      pcVar4 = helper_addu_s_qb_mips64el;
      break;
    case 5:
      check_dsp(ctx);
      local_48 = (TCGTemp *)(s->cpu_env + (long)s);
      pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
      pcVar4 = helper_subu_s_qb_mips64el;
      break;
    case 8:
      check_dsp_r2(ctx);
      local_48 = (TCGTemp *)(s->cpu_env + (long)s);
      pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
      pcVar4 = helper_addu_ph_mips64el;
      break;
    case 9:
      check_dsp_r2(ctx);
      local_48 = (TCGTemp *)(s->cpu_env + (long)s);
      pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
      pcVar4 = helper_subu_ph_mips64el;
      break;
    case 10:
      check_dsp(ctx);
      local_48 = (TCGTemp *)(s->cpu_env + (long)s);
      pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
      pcVar4 = helper_addq_ph_mips64el;
      break;
    case 0xb:
      check_dsp(ctx);
      local_48 = (TCGTemp *)(s->cpu_env + (long)s);
      pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
      pcVar4 = helper_subq_ph_mips64el;
      break;
    case 0xc:
      check_dsp_r2(ctx);
      local_48 = (TCGTemp *)(s->cpu_env + (long)s);
      pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
      pcVar4 = helper_addu_s_ph_mips64el;
      break;
    case 0xd:
      check_dsp_r2(ctx);
      local_48 = (TCGTemp *)(s->cpu_env + (long)s);
      pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
      pcVar4 = helper_subu_s_ph_mips64el;
      break;
    case 0xe:
      check_dsp(ctx);
      local_48 = (TCGTemp *)(s->cpu_env + (long)s);
      pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
      pcVar4 = helper_addq_s_ph_mips64el;
      break;
    case 0xf:
      check_dsp(ctx);
      local_48 = (TCGTemp *)(s->cpu_env + (long)s);
      pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
      pcVar4 = helper_subq_s_ph_mips64el;
      break;
    case 0x10:
      check_dsp(ctx);
      local_48 = (TCGTemp *)(s->cpu_env + (long)s);
      pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
      pcVar4 = helper_addsc_mips64el;
      break;
    case 0x11:
      check_dsp(ctx);
      local_48 = (TCGTemp *)(s->cpu_env + (long)s);
      pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
      pcVar4 = helper_addwc_mips64el;
      break;
    case 0x12:
      check_dsp(ctx);
      pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
      local_58 = (TCGTemp *)((long)s + (long)pTVar5);
      local_50 = (TCGTemp *)((long)s + (long)arg1);
      pcVar4 = helper_modsub_mips64el;
      goto LAB_009bb534;
    case 0x14:
      check_dsp(ctx);
      pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
      local_58 = (TCGTemp *)((long)s + (long)pTVar5);
      pcVar4 = helper_raddu_w_qb_mips64el;
      goto LAB_009bb30e;
    case 0x16:
      check_dsp(ctx);
      local_48 = (TCGTemp *)(s->cpu_env + (long)s);
      pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
      pcVar4 = helper_addq_s_w_mips64el;
      break;
    case 0x17:
      check_dsp(ctx);
      local_48 = (TCGTemp *)(s->cpu_env + (long)s);
      pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
      pcVar4 = helper_subq_s_w_mips64el;
    }
    goto LAB_009bb4f6;
  case 0x7c000011:
    if (iVar6 < 0x7c000511) {
      if (iVar6 == 0x7c000311) {
        check_dsp(ctx);
        pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
        local_58 = (TCGTemp *)((long)s + (long)pTVar5);
        local_50 = (TCGTemp *)((long)s + (long)arg1);
        pcVar4 = helper_precrq_qb_ph_mips64el;
      }
      else {
        if (iVar6 != 0x7c000351) {
          if (iVar6 != 0x7c0003d1) goto switchD_009b9d17_caseD_7c000013;
          check_dsp(ctx);
          local_48 = (TCGTemp *)(s->cpu_env + (long)s);
          pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
          pcVar4 = helper_precrqu_s_qb_ph_mips64el;
          goto LAB_009bb4f6;
        }
        check_dsp_r2(ctx);
        pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
        local_58 = (TCGTemp *)((long)s + (long)pTVar5);
        local_50 = (TCGTemp *)((long)s + (long)arg1);
        pcVar4 = helper_precr_qb_ph_mips64el;
      }
    }
    else {
      if (0x7c000790 < iVar6) {
        if (iVar6 == 0x7c000791) {
          check_dsp_r2(ctx);
          pTVar3 = tcg_const_i32_mips64el(s,local_3c);
          pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
          pTVar2 = (TCGTemp *)(pTVar3 + (long)&s->pool_cur);
          pcVar4 = helper_precr_sra_ph_w_mips64el;
          local_58 = pTVar2;
          local_50 = (TCGTemp *)((long)s + (long)pTVar5);
          local_48 = pTVar1;
        }
        else {
          if (iVar6 != 0x7c0007d1) goto switchD_009b9d17_caseD_7c000013;
          check_dsp_r2(ctx);
          pTVar3 = tcg_const_i32_mips64el(s,local_3c);
          pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
          pTVar2 = (TCGTemp *)(pTVar3 + (long)&s->pool_cur);
          pcVar4 = helper_precr_sra_r_ph_w_mips64el;
          local_58 = pTVar2;
          local_50 = (TCGTemp *)((long)s + (long)pTVar5);
          local_48 = pTVar1;
        }
        goto LAB_009ba2b4;
      }
      if (iVar6 != 0x7c000511) {
        if (iVar6 != 0x7c000551) goto switchD_009b9d17_caseD_7c000013;
        check_dsp(ctx);
        local_48 = (TCGTemp *)(s->cpu_env + (long)s);
        pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
        pcVar4 = helper_precrq_rs_ph_w_mips64el;
        goto LAB_009bb4f6;
      }
      check_dsp(ctx);
      pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
      local_58 = (TCGTemp *)((long)s + (long)pTVar5);
      local_50 = (TCGTemp *)((long)s + (long)arg1);
      pcVar4 = helper_precrq_ph_w_mips64el;
    }
    goto LAB_009bb534;
  case 0x7c000012:
    switch((iVar6 + 0x83ffffaeU) * 0x4000000 | iVar6 + 0x83ffffaeU >> 6) {
    case 0:
      check_dsp_r2(ctx);
      local_50 = (TCGTemp *)(s->cpu_env + (long)s);
      pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
      local_58 = (TCGTemp *)((long)s + (long)arg1);
      pcVar4 = helper_absq_s_qb_mips64el;
      goto LAB_009bb534;
    default:
      goto switchD_009b9d17_caseD_7c000013;
    case 3:
      check_dsp(ctx);
      pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
      local_58 = (TCGTemp *)((long)s + (long)arg1);
      pcVar4 = helper_precequ_ph_qbl_mips64el;
      break;
    case 4:
      check_dsp(ctx);
      pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
      local_58 = (TCGTemp *)((long)s + (long)arg1);
      pcVar4 = helper_precequ_ph_qbr_mips64el;
      break;
    case 5:
      check_dsp(ctx);
      pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
      local_58 = (TCGTemp *)((long)s + (long)arg1);
      pcVar4 = helper_precequ_ph_qbla_mips64el;
      break;
    case 6:
      check_dsp(ctx);
      pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
      local_58 = (TCGTemp *)((long)s + (long)arg1);
      pcVar4 = helper_precequ_ph_qbra_mips64el;
      break;
    case 8:
      check_dsp(ctx);
      local_50 = (TCGTemp *)(s->cpu_env + (long)s);
      pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
      local_58 = (TCGTemp *)((long)s + (long)arg1);
      pcVar4 = helper_absq_s_ph_mips64el;
      goto LAB_009bb534;
    case 0xb:
      check_dsp(ctx);
      tcg_gen_andi_i64_mips64el(s,s->cpu_gpr[(uint)ret],arg1,0xffff0000);
      goto LAB_009ba7ab;
    case 0xc:
      check_dsp(ctx);
      tcg_gen_andi_i64_mips64el(s,s->cpu_gpr[(uint)ret],arg1,0xffff);
      tcg_gen_shli_i64_mips64el(s,s->cpu_gpr[(uint)ret],s->cpu_gpr[(uint)ret],0x10);
LAB_009ba7ab:
      tcg_gen_ext32s_i64_mips64el(s,s->cpu_gpr[(uint)ret],s->cpu_gpr[(uint)ret]);
      goto switchD_009b9d17_caseD_7c000013;
    case 0x10:
      check_dsp(ctx);
      local_50 = (TCGTemp *)(s->cpu_env + (long)s);
      pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
      local_58 = (TCGTemp *)((long)s + (long)arg1);
      pcVar4 = helper_absq_s_w_mips64el;
      goto LAB_009bb534;
    case 0x1b:
      check_dsp(ctx);
      pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
      local_58 = (TCGTemp *)((long)s + (long)arg1);
      pcVar4 = helper_preceu_ph_qbl_mips64el;
      break;
    case 0x1c:
      check_dsp(ctx);
      pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
      local_58 = (TCGTemp *)((long)s + (long)arg1);
      pcVar4 = helper_preceu_ph_qbr_mips64el;
      break;
    case 0x1d:
      check_dsp(ctx);
      pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
      local_58 = (TCGTemp *)((long)s + (long)arg1);
      pcVar4 = helper_preceu_ph_qbla_mips64el;
      break;
    case 0x1e:
      check_dsp(ctx);
      pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
      local_58 = (TCGTemp *)((long)s + (long)arg1);
      pcVar4 = helper_preceu_ph_qbra_mips64el;
    }
LAB_009bb30e:
    iVar6 = 1;
    goto LAB_009bb53c;
  default:
    goto switchD_009b9d17_caseD_7c000013;
  case 0x7c000014:
    break;
  case 0x7c000015:
    switch((iVar6 + 0x83fffcebU) * 0x4000000 | iVar6 + 0x83fffcebU >> 6) {
    case 0:
      check_dsp(ctx);
      pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
      local_58 = (TCGTemp *)((long)s + (long)pTVar5);
      local_50 = (TCGTemp *)((long)s + (long)arg1);
      pcVar4 = helper_precrq_ob_qh_mips64el;
      break;
    case 1:
      check_dsp_r2(ctx);
      pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
      local_58 = (TCGTemp *)((long)s + (long)pTVar5);
      local_50 = (TCGTemp *)((long)s + (long)arg1);
      pcVar4 = helper_precr_ob_qh_mips64el;
      break;
    default:
      goto switchD_009b9d17_caseD_7c000013;
    case 3:
      check_dsp(ctx);
      local_48 = (TCGTemp *)(s->cpu_env + (long)s);
      pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
      pcVar4 = helper_precrqu_s_ob_qh_mips64el;
      goto LAB_009bb4f6;
    case 8:
      check_dsp(ctx);
      pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
      local_58 = (TCGTemp *)((long)s + (long)pTVar5);
      local_50 = (TCGTemp *)((long)s + (long)arg1);
      pcVar4 = helper_precrq_qh_pw_mips64el;
      break;
    case 9:
      check_dsp(ctx);
      local_48 = (TCGTemp *)(s->cpu_env + (long)s);
      pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
      pcVar4 = helper_precrq_rs_qh_pw_mips64el;
      goto LAB_009bb4f6;
    case 0x10:
      check_dsp(ctx);
      pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
      local_58 = (TCGTemp *)((long)s + (long)pTVar5);
      local_50 = (TCGTemp *)((long)s + (long)arg1);
      pcVar4 = helper_precrq_pw_l_mips64el;
      break;
    case 0x12:
      check_dsp_r2(ctx);
      pTVar3 = tcg_const_i32_mips64el(s,ret);
      local_58 = (TCGTemp *)((long)s + (long)pTVar5);
      pTVar1 = (TCGTemp *)((long)s + (long)arg1);
      pTVar2 = (TCGTemp *)(pTVar3 + (long)&s->pool_cur);
      pcVar4 = helper_precr_sra_qh_pw_mips64el;
      local_50 = pTVar1;
      local_48 = pTVar2;
      goto LAB_009ba2b4;
    case 0x13:
      check_dsp_r2(ctx);
      pTVar3 = tcg_const_i32_mips64el(s,ret);
      local_58 = (TCGTemp *)((long)s + (long)pTVar5);
      pTVar1 = (TCGTemp *)((long)s + (long)arg1);
      pTVar2 = (TCGTemp *)(pTVar3 + (long)&s->pool_cur);
      pcVar4 = helper_precr_sra_r_qh_pw_mips64el;
      local_50 = pTVar1;
      local_48 = pTVar2;
LAB_009ba2b4:
      tcg_gen_callN_mips64el(s,pcVar4,pTVar1,3,&local_58);
      tcg_temp_free_internal_mips64el(s,pTVar2);
      goto switchD_009b9d17_caseD_7c000013;
    }
    goto LAB_009bb534;
  case 0x7c000016:
    switch((iVar6 + 0x83ffffaaU) * 0x4000000 | iVar6 + 0x83ffffaaU >> 6) {
    case 0:
      check_dsp_r2(ctx);
      local_50 = (TCGTemp *)(s->cpu_env + (long)s);
      pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
      local_58 = (TCGTemp *)((long)s + (long)arg1);
      pcVar4 = helper_absq_s_ob_mips64el;
      goto LAB_009bb534;
    default:
      goto switchD_009b9d17_caseD_7c000013;
    case 3:
      check_dsp(ctx);
      pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
      local_58 = (TCGTemp *)((long)s + (long)arg1);
      pcVar4 = helper_precequ_qh_obl_mips64el;
      break;
    case 4:
      check_dsp(ctx);
      pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
      local_58 = (TCGTemp *)((long)s + (long)arg1);
      pcVar4 = helper_precequ_qh_obr_mips64el;
      break;
    case 5:
      check_dsp(ctx);
      pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
      local_58 = (TCGTemp *)((long)s + (long)arg1);
      pcVar4 = helper_precequ_qh_obla_mips64el;
      break;
    case 6:
      check_dsp(ctx);
      pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
      local_58 = (TCGTemp *)((long)s + (long)arg1);
      pcVar4 = helper_precequ_qh_obra_mips64el;
      break;
    case 8:
      check_dsp(ctx);
      local_50 = (TCGTemp *)(s->cpu_env + (long)s);
      pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
      local_58 = (TCGTemp *)((long)s + (long)arg1);
      pcVar4 = helper_absq_s_qh_mips64el;
      goto LAB_009bb534;
    case 0xb:
      check_dsp(ctx);
      pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
      local_58 = (TCGTemp *)((long)s + (long)arg1);
      pcVar4 = helper_preceq_pw_qhl_mips64el;
      break;
    case 0xc:
      check_dsp(ctx);
      pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
      local_58 = (TCGTemp *)((long)s + (long)arg1);
      pcVar4 = helper_preceq_pw_qhr_mips64el;
      break;
    case 0xd:
      check_dsp(ctx);
      pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
      local_58 = (TCGTemp *)((long)s + (long)arg1);
      pcVar4 = helper_preceq_pw_qhla_mips64el;
      break;
    case 0xe:
      check_dsp(ctx);
      pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
      local_58 = (TCGTemp *)((long)s + (long)arg1);
      pcVar4 = helper_preceq_pw_qhra_mips64el;
      break;
    case 0x10:
      check_dsp(ctx);
      local_50 = (TCGTemp *)(s->cpu_env + (long)s);
      pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
      local_58 = (TCGTemp *)((long)s + (long)arg1);
      pcVar4 = helper_absq_s_pw_mips64el;
      goto LAB_009bb534;
    case 0x13:
      check_dsp(ctx);
      tcg_gen_andi_i64_mips64el(s,s->cpu_gpr[(uint)ret],arg1,-0x100000000);
      goto switchD_009b9d17_caseD_7c000013;
    case 0x14:
      check_dsp(ctx);
      tcg_gen_shli_i64_mips64el(s,s->cpu_gpr[(uint)ret],arg1,0x20);
      goto switchD_009b9d17_caseD_7c000013;
    case 0x1b:
      check_dsp(ctx);
      pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
      local_58 = (TCGTemp *)((long)s + (long)arg1);
      pcVar4 = helper_preceu_qh_obl_mips64el;
      break;
    case 0x1c:
      check_dsp(ctx);
      pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
      local_58 = (TCGTemp *)((long)s + (long)arg1);
      pcVar4 = helper_preceu_qh_obr_mips64el;
      break;
    case 0x1d:
      check_dsp(ctx);
      pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
      local_58 = (TCGTemp *)((long)s + (long)arg1);
      pcVar4 = helper_preceu_qh_obla_mips64el;
      break;
    case 0x1e:
      check_dsp(ctx);
      pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
      local_58 = (TCGTemp *)((long)s + (long)arg1);
      pcVar4 = helper_preceu_qh_obra_mips64el;
    }
    goto LAB_009bb30e;
  case 0x7c000018:
    if ((ctx->hflags & 0x100000) == 0) {
      gen_mipsdsp_arith_cold_1();
    }
    switch((iVar6 + 0x83ffffe8U) * 0x4000000 | iVar6 + 0x83ffffe8U >> 6) {
    case 0:
      pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
      local_58 = (TCGTemp *)((long)s + (long)pTVar5);
      local_50 = (TCGTemp *)((long)s + (long)arg1);
      pcVar4 = helper_adduh_qb_mips64el;
      break;
    case 1:
      pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
      local_58 = (TCGTemp *)((long)s + (long)pTVar5);
      local_50 = (TCGTemp *)((long)s + (long)arg1);
      pcVar4 = helper_subuh_qb_mips64el;
      break;
    case 2:
      pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
      local_58 = (TCGTemp *)((long)s + (long)pTVar5);
      local_50 = (TCGTemp *)((long)s + (long)arg1);
      pcVar4 = helper_adduh_r_qb_mips64el;
      break;
    case 3:
      pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
      local_58 = (TCGTemp *)((long)s + (long)pTVar5);
      local_50 = (TCGTemp *)((long)s + (long)arg1);
      pcVar4 = helper_subuh_r_qb_mips64el;
      break;
    default:
      goto switchD_009b9d17_caseD_7c000013;
    case 8:
      pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
      local_58 = (TCGTemp *)((long)s + (long)pTVar5);
      local_50 = (TCGTemp *)((long)s + (long)arg1);
      pcVar4 = helper_addqh_ph_mips64el;
      break;
    case 9:
      pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
      local_58 = (TCGTemp *)((long)s + (long)pTVar5);
      local_50 = (TCGTemp *)((long)s + (long)arg1);
      pcVar4 = helper_subqh_ph_mips64el;
      break;
    case 10:
      pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
      local_58 = (TCGTemp *)((long)s + (long)pTVar5);
      local_50 = (TCGTemp *)((long)s + (long)arg1);
      pcVar4 = helper_addqh_r_ph_mips64el;
      break;
    case 0xb:
      pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
      local_58 = (TCGTemp *)((long)s + (long)pTVar5);
      local_50 = (TCGTemp *)((long)s + (long)arg1);
      pcVar4 = helper_subqh_r_ph_mips64el;
      break;
    case 0x10:
      pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
      local_58 = (TCGTemp *)((long)s + (long)pTVar5);
      local_50 = (TCGTemp *)((long)s + (long)arg1);
      pcVar4 = helper_addqh_w_mips64el;
      break;
    case 0x11:
      pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
      local_58 = (TCGTemp *)((long)s + (long)pTVar5);
      local_50 = (TCGTemp *)((long)s + (long)arg1);
      pcVar4 = helper_subqh_w_mips64el;
      break;
    case 0x12:
      pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
      local_58 = (TCGTemp *)((long)s + (long)pTVar5);
      local_50 = (TCGTemp *)((long)s + (long)arg1);
      pcVar4 = helper_addqh_r_w_mips64el;
      break;
    case 0x13:
      pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
      local_58 = (TCGTemp *)((long)s + (long)pTVar5);
      local_50 = (TCGTemp *)((long)s + (long)arg1);
      pcVar4 = helper_subqh_r_w_mips64el;
    }
    goto LAB_009bb534;
  }
  switch((iVar6 + 0x83ffffecU) * 0x4000000 | iVar6 + 0x83ffffecU >> 6) {
  case 0:
    check_dsp(ctx);
    local_48 = (TCGTemp *)(s->cpu_env + (long)s);
    pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
    pcVar4 = helper_addu_ob_mips64el;
    break;
  case 1:
    check_dsp(ctx);
    local_48 = (TCGTemp *)(s->cpu_env + (long)s);
    pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
    pcVar4 = helper_subu_ob_mips64el;
    break;
  default:
    goto switchD_009b9d17_caseD_7c000013;
  case 4:
    check_dsp(ctx);
    local_48 = (TCGTemp *)(s->cpu_env + (long)s);
    pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
    pcVar4 = helper_addu_s_ob_mips64el;
    break;
  case 5:
    check_dsp(ctx);
    local_48 = (TCGTemp *)(s->cpu_env + (long)s);
    pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
    pcVar4 = helper_subu_s_ob_mips64el;
    break;
  case 8:
    check_dsp_r2(ctx);
    local_48 = (TCGTemp *)(s->cpu_env + (long)s);
    pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
    pcVar4 = helper_addu_qh_mips64el;
    break;
  case 9:
    check_dsp_r2(ctx);
    local_48 = (TCGTemp *)(s->cpu_env + (long)s);
    pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
    pcVar4 = helper_subu_qh_mips64el;
    break;
  case 10:
    check_dsp(ctx);
    local_48 = (TCGTemp *)(s->cpu_env + (long)s);
    pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
    pcVar4 = helper_addq_qh_mips64el;
    break;
  case 0xb:
    check_dsp(ctx);
    local_48 = (TCGTemp *)(s->cpu_env + (long)s);
    pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
    pcVar4 = helper_subq_qh_mips64el;
    break;
  case 0xc:
    check_dsp_r2(ctx);
    local_48 = (TCGTemp *)(s->cpu_env + (long)s);
    pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
    pcVar4 = helper_addu_s_qh_mips64el;
    break;
  case 0xd:
    check_dsp_r2(ctx);
    local_48 = (TCGTemp *)(s->cpu_env + (long)s);
    pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
    pcVar4 = helper_subu_s_qh_mips64el;
    break;
  case 0xe:
    check_dsp(ctx);
    local_48 = (TCGTemp *)(s->cpu_env + (long)s);
    pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
    pcVar4 = helper_addq_s_qh_mips64el;
    break;
  case 0xf:
    check_dsp(ctx);
    local_48 = (TCGTemp *)(s->cpu_env + (long)s);
    pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
    pcVar4 = helper_subq_s_qh_mips64el;
    break;
  case 0x12:
    check_dsp(ctx);
    local_48 = (TCGTemp *)(s->cpu_env + (long)s);
    pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
    pcVar4 = helper_addq_pw_mips64el;
    break;
  case 0x13:
    check_dsp(ctx);
    local_48 = (TCGTemp *)(s->cpu_env + (long)s);
    pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
    pcVar4 = helper_subq_pw_mips64el;
    break;
  case 0x14:
    check_dsp(ctx);
    pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
    local_58 = (TCGTemp *)((long)s + (long)pTVar5);
    pcVar4 = helper_raddu_l_ob_mips64el;
    goto LAB_009bb30e;
  case 0x16:
    check_dsp(ctx);
    local_48 = (TCGTemp *)(s->cpu_env + (long)s);
    pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
    pcVar4 = helper_addq_s_pw_mips64el;
    break;
  case 0x17:
    check_dsp(ctx);
    local_48 = (TCGTemp *)(s->cpu_env + (long)s);
    pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
    pcVar4 = helper_subq_s_pw_mips64el;
    break;
  case 0x18:
    check_dsp_r2(ctx);
    pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
    local_58 = (TCGTemp *)((long)s + (long)pTVar5);
    local_50 = (TCGTemp *)((long)s + (long)arg1);
    pcVar4 = helper_adduh_ob_mips64el;
    goto LAB_009bb534;
  case 0x19:
    check_dsp_r2(ctx);
    pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
    local_58 = (TCGTemp *)((long)s + (long)pTVar5);
    local_50 = (TCGTemp *)((long)s + (long)arg1);
    pcVar4 = helper_subuh_ob_mips64el;
    goto LAB_009bb534;
  case 0x1a:
    check_dsp_r2(ctx);
    pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
    local_58 = (TCGTemp *)((long)s + (long)pTVar5);
    local_50 = (TCGTemp *)((long)s + (long)arg1);
    pcVar4 = helper_adduh_r_ob_mips64el;
    goto LAB_009bb534;
  case 0x1b:
    check_dsp_r2(ctx);
    pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
    local_58 = (TCGTemp *)((long)s + (long)pTVar5);
    local_50 = (TCGTemp *)((long)s + (long)arg1);
    pcVar4 = helper_subuh_r_ob_mips64el;
LAB_009bb534:
    iVar6 = 2;
    goto LAB_009bb53c;
  }
LAB_009bb4f6:
  local_50 = (TCGTemp *)((long)s + (long)arg1);
  local_58 = (TCGTemp *)((long)s + (long)pTVar5);
  iVar6 = 3;
LAB_009bb53c:
  tcg_gen_callN_mips64el(s,pcVar4,pTVar1,iVar6,&local_58);
switchD_009b9d17_caseD_7c000013:
  tcg_temp_free_internal_mips64el(s,(TCGTemp *)(pTVar5 + (long)s));
  tcg_temp_free_internal_mips64el(s,(TCGTemp *)(arg1 + (long)s));
  return;
}

Assistant:

static void gen_mipsdsp_arith(DisasContext *ctx, uint32_t op1, uint32_t op2,
                              int ret, int v1, int v2)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv v1_t;
    TCGv v2_t;

    if (ret == 0) {
        /* Treat as NOP. */
        return;
    }

    v1_t = tcg_temp_new(tcg_ctx);
    v2_t = tcg_temp_new(tcg_ctx);

    gen_load_gpr(tcg_ctx, v1_t, v1);
    gen_load_gpr(tcg_ctx, v2_t, v2);

    switch (op1) {
    /* OPC_MULT_G_2E is equal OPC_ADDUH_QB_DSP */
    case OPC_MULT_G_2E:
        check_dsp_r2(ctx);
        switch (op2) {
        case OPC_ADDUH_QB:
            gen_helper_adduh_qb(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_ADDUH_R_QB:
            gen_helper_adduh_r_qb(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_ADDQH_PH:
            gen_helper_addqh_ph(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_ADDQH_R_PH:
            gen_helper_addqh_r_ph(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_ADDQH_W:
            gen_helper_addqh_w(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_ADDQH_R_W:
            gen_helper_addqh_r_w(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_SUBUH_QB:
            gen_helper_subuh_qb(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_SUBUH_R_QB:
            gen_helper_subuh_r_qb(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_SUBQH_PH:
            gen_helper_subqh_ph(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_SUBQH_R_PH:
            gen_helper_subqh_r_ph(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_SUBQH_W:
            gen_helper_subqh_w(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_SUBQH_R_W:
            gen_helper_subqh_r_w(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        }
        break;
    case OPC_ABSQ_S_PH_DSP:
        switch (op2) {
        case OPC_ABSQ_S_QB:
            check_dsp_r2(ctx);
            gen_helper_absq_s_qb(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_ABSQ_S_PH:
            check_dsp(ctx);
            gen_helper_absq_s_ph(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_ABSQ_S_W:
            check_dsp(ctx);
            gen_helper_absq_s_w(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_PRECEQ_W_PHL:
            check_dsp(ctx);
            tcg_gen_andi_tl(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t, 0xFFFF0000);
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[ret], tcg_ctx->cpu_gpr[ret]);
            break;
        case OPC_PRECEQ_W_PHR:
            check_dsp(ctx);
            tcg_gen_andi_tl(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t, 0x0000FFFF);
            tcg_gen_shli_tl(tcg_ctx, tcg_ctx->cpu_gpr[ret], tcg_ctx->cpu_gpr[ret], 16);
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[ret], tcg_ctx->cpu_gpr[ret]);
            break;
        case OPC_PRECEQU_PH_QBL:
            check_dsp(ctx);
            gen_helper_precequ_ph_qbl(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t);
            break;
        case OPC_PRECEQU_PH_QBR:
            check_dsp(ctx);
            gen_helper_precequ_ph_qbr(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t);
            break;
        case OPC_PRECEQU_PH_QBLA:
            check_dsp(ctx);
            gen_helper_precequ_ph_qbla(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t);
            break;
        case OPC_PRECEQU_PH_QBRA:
            check_dsp(ctx);
            gen_helper_precequ_ph_qbra(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t);
            break;
        case OPC_PRECEU_PH_QBL:
            check_dsp(ctx);
            gen_helper_preceu_ph_qbl(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t);
            break;
        case OPC_PRECEU_PH_QBR:
            check_dsp(ctx);
            gen_helper_preceu_ph_qbr(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t);
            break;
        case OPC_PRECEU_PH_QBLA:
            check_dsp(ctx);
            gen_helper_preceu_ph_qbla(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t);
            break;
        case OPC_PRECEU_PH_QBRA:
            check_dsp(ctx);
            gen_helper_preceu_ph_qbra(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t);
            break;
        }
        break;
    case OPC_ADDU_QB_DSP:
        switch (op2) {
        case OPC_ADDQ_PH:
            check_dsp(ctx);
            gen_helper_addq_ph(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_ADDQ_S_PH:
            check_dsp(ctx);
            gen_helper_addq_s_ph(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_ADDQ_S_W:
            check_dsp(ctx);
            gen_helper_addq_s_w(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_ADDU_QB:
            check_dsp(ctx);
            gen_helper_addu_qb(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_ADDU_S_QB:
            check_dsp(ctx);
            gen_helper_addu_s_qb(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_ADDU_PH:
            check_dsp_r2(ctx);
            gen_helper_addu_ph(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_ADDU_S_PH:
            check_dsp_r2(ctx);
            gen_helper_addu_s_ph(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_SUBQ_PH:
            check_dsp(ctx);
            gen_helper_subq_ph(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_SUBQ_S_PH:
            check_dsp(ctx);
            gen_helper_subq_s_ph(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_SUBQ_S_W:
            check_dsp(ctx);
            gen_helper_subq_s_w(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_SUBU_QB:
            check_dsp(ctx);
            gen_helper_subu_qb(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_SUBU_S_QB:
            check_dsp(ctx);
            gen_helper_subu_s_qb(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_SUBU_PH:
            check_dsp_r2(ctx);
            gen_helper_subu_ph(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_SUBU_S_PH:
            check_dsp_r2(ctx);
            gen_helper_subu_s_ph(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_ADDSC:
            check_dsp(ctx);
            gen_helper_addsc(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_ADDWC:
            check_dsp(ctx);
            gen_helper_addwc(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_MODSUB:
            check_dsp(ctx);
            gen_helper_modsub(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_RADDU_W_QB:
            check_dsp(ctx);
            gen_helper_raddu_w_qb(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t);
            break;
        }
        break;
    case OPC_CMPU_EQ_QB_DSP:
        switch (op2) {
        case OPC_PRECR_QB_PH:
            check_dsp_r2(ctx);
            gen_helper_precr_qb_ph(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_PRECRQ_QB_PH:
            check_dsp(ctx);
            gen_helper_precrq_qb_ph(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_PRECR_SRA_PH_W:
            check_dsp_r2(ctx);
            {
                TCGv_i32 sa_t = tcg_const_i32(tcg_ctx, v2);
                gen_helper_precr_sra_ph_w(tcg_ctx, tcg_ctx->cpu_gpr[ret], sa_t, v1_t,
                                          tcg_ctx->cpu_gpr[ret]);
                tcg_temp_free_i32(tcg_ctx, sa_t);
                break;
            }
        case OPC_PRECR_SRA_R_PH_W:
            check_dsp_r2(ctx);
            {
                TCGv_i32 sa_t = tcg_const_i32(tcg_ctx, v2);
                gen_helper_precr_sra_r_ph_w(tcg_ctx, tcg_ctx->cpu_gpr[ret], sa_t, v1_t,
                                            tcg_ctx->cpu_gpr[ret]);
                tcg_temp_free_i32(tcg_ctx, sa_t);
                break;
            }
        case OPC_PRECRQ_PH_W:
            check_dsp(ctx);
            gen_helper_precrq_ph_w(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_PRECRQ_RS_PH_W:
            check_dsp(ctx);
            gen_helper_precrq_rs_ph_w(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_PRECRQU_S_QB_PH:
            check_dsp(ctx);
            gen_helper_precrqu_s_qb_ph(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        }
        break;
#ifdef TARGET_MIPS64
    case OPC_ABSQ_S_QH_DSP:
        switch (op2) {
        case OPC_PRECEQ_L_PWL:
            check_dsp(ctx);
            tcg_gen_andi_tl(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t, 0xFFFFFFFF00000000ull);
            break;
        case OPC_PRECEQ_L_PWR:
            check_dsp(ctx);
            tcg_gen_shli_tl(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t, 32);
            break;
        case OPC_PRECEQ_PW_QHL:
            check_dsp(ctx);
            gen_helper_preceq_pw_qhl(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t);
            break;
        case OPC_PRECEQ_PW_QHR:
            check_dsp(ctx);
            gen_helper_preceq_pw_qhr(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t);
            break;
        case OPC_PRECEQ_PW_QHLA:
            check_dsp(ctx);
            gen_helper_preceq_pw_qhla(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t);
            break;
        case OPC_PRECEQ_PW_QHRA:
            check_dsp(ctx);
            gen_helper_preceq_pw_qhra(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t);
            break;
        case OPC_PRECEQU_QH_OBL:
            check_dsp(ctx);
            gen_helper_precequ_qh_obl(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t);
            break;
        case OPC_PRECEQU_QH_OBR:
            check_dsp(ctx);
            gen_helper_precequ_qh_obr(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t);
            break;
        case OPC_PRECEQU_QH_OBLA:
            check_dsp(ctx);
            gen_helper_precequ_qh_obla(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t);
            break;
        case OPC_PRECEQU_QH_OBRA:
            check_dsp(ctx);
            gen_helper_precequ_qh_obra(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t);
            break;
        case OPC_PRECEU_QH_OBL:
            check_dsp(ctx);
            gen_helper_preceu_qh_obl(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t);
            break;
        case OPC_PRECEU_QH_OBR:
            check_dsp(ctx);
            gen_helper_preceu_qh_obr(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t);
            break;
        case OPC_PRECEU_QH_OBLA:
            check_dsp(ctx);
            gen_helper_preceu_qh_obla(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t);
            break;
        case OPC_PRECEU_QH_OBRA:
            check_dsp(ctx);
            gen_helper_preceu_qh_obra(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t);
            break;
        case OPC_ABSQ_S_OB:
            check_dsp_r2(ctx);
            gen_helper_absq_s_ob(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_ABSQ_S_PW:
            check_dsp(ctx);
            gen_helper_absq_s_pw(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_ABSQ_S_QH:
            check_dsp(ctx);
            gen_helper_absq_s_qh(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t, tcg_ctx->cpu_env);
            break;
        }
        break;
    case OPC_ADDU_OB_DSP:
        switch (op2) {
        case OPC_RADDU_L_OB:
            check_dsp(ctx);
            gen_helper_raddu_l_ob(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t);
            break;
        case OPC_SUBQ_PW:
            check_dsp(ctx);
            gen_helper_subq_pw(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_SUBQ_S_PW:
            check_dsp(ctx);
            gen_helper_subq_s_pw(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_SUBQ_QH:
            check_dsp(ctx);
            gen_helper_subq_qh(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_SUBQ_S_QH:
            check_dsp(ctx);
            gen_helper_subq_s_qh(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_SUBU_OB:
            check_dsp(ctx);
            gen_helper_subu_ob(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_SUBU_S_OB:
            check_dsp(ctx);
            gen_helper_subu_s_ob(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_SUBU_QH:
            check_dsp_r2(ctx);
            gen_helper_subu_qh(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_SUBU_S_QH:
            check_dsp_r2(ctx);
            gen_helper_subu_s_qh(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_SUBUH_OB:
            check_dsp_r2(ctx);
            gen_helper_subuh_ob(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_SUBUH_R_OB:
            check_dsp_r2(ctx);
            gen_helper_subuh_r_ob(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_ADDQ_PW:
            check_dsp(ctx);
            gen_helper_addq_pw(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_ADDQ_S_PW:
            check_dsp(ctx);
            gen_helper_addq_s_pw(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_ADDQ_QH:
            check_dsp(ctx);
            gen_helper_addq_qh(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_ADDQ_S_QH:
            check_dsp(ctx);
            gen_helper_addq_s_qh(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_ADDU_OB:
            check_dsp(ctx);
            gen_helper_addu_ob(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_ADDU_S_OB:
            check_dsp(ctx);
            gen_helper_addu_s_ob(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_ADDU_QH:
            check_dsp_r2(ctx);
            gen_helper_addu_qh(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_ADDU_S_QH:
            check_dsp_r2(ctx);
            gen_helper_addu_s_qh(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_ADDUH_OB:
            check_dsp_r2(ctx);
            gen_helper_adduh_ob(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_ADDUH_R_OB:
            check_dsp_r2(ctx);
            gen_helper_adduh_r_ob(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        }
        break;
    case OPC_CMPU_EQ_OB_DSP:
        switch (op2) {
        case OPC_PRECR_OB_QH:
            check_dsp_r2(ctx);
            gen_helper_precr_ob_qh(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_PRECR_SRA_QH_PW:
            check_dsp_r2(ctx);
            {
                TCGv_i32 ret_t = tcg_const_i32(tcg_ctx, ret);
                gen_helper_precr_sra_qh_pw(tcg_ctx, v2_t, v1_t, v2_t, ret_t);
                tcg_temp_free_i32(tcg_ctx, ret_t);
                break;
            }
        case OPC_PRECR_SRA_R_QH_PW:
            check_dsp_r2(ctx);
            {
                TCGv_i32 sa_v = tcg_const_i32(tcg_ctx, ret);
                gen_helper_precr_sra_r_qh_pw(tcg_ctx, v2_t, v1_t, v2_t, sa_v);
                tcg_temp_free_i32(tcg_ctx, sa_v);
                break;
            }
        case OPC_PRECRQ_OB_QH:
            check_dsp(ctx);
            gen_helper_precrq_ob_qh(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_PRECRQ_PW_L:
            check_dsp(ctx);
            gen_helper_precrq_pw_l(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_PRECRQ_QH_PW:
            check_dsp(ctx);
            gen_helper_precrq_qh_pw(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_PRECRQ_RS_QH_PW:
            check_dsp(ctx);
            gen_helper_precrq_rs_qh_pw(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_PRECRQU_S_OB_QH:
            check_dsp(ctx);
            gen_helper_precrqu_s_ob_qh(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        }
        break;
#endif
    }

    tcg_temp_free(tcg_ctx, v1_t);
    tcg_temp_free(tcg_ctx, v2_t);
}